

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well-founded.cpp
# Opt level: O3

bool __thiscall WellFounded::propagate(WellFounded *this)

{
  uint uVar1;
  int *piVar2;
  Lit *pLVar3;
  ConjRule *pCVar4;
  anon_union_8_2_743a5d44_for_Reason_0 r;
  bool bVar5;
  vec<int> *pvVar6;
  int **ppiVar7;
  vec<ConjRule_*> *pvVar8;
  lbool lVar9;
  int *piVar10;
  char *pcVar11;
  bool *pbVar12;
  uint uVar13;
  char cVar14;
  int iVar15;
  uint *puVar16;
  vec<int> *pvVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  Clause *c;
  uint local_5c;
  vec<Lit> local_58;
  vec<int> *local_48;
  int **local_40;
  anon_union_8_2_743a5d44_for_Reason_0 local_38;
  
  if ((this->dead_rules).sz != 0) {
    uVar21 = 0;
    do {
      killSupport(this,(this->rules).data[(uint)(this->dead_rules).data[uVar21]]);
      uVar21 = uVar21 + 1;
    } while (uVar21 < (this->dead_rules).sz);
  }
  uVar18 = (this->no_support).sz;
  if (uVar18 != 0) {
    pvVar6 = (this->no_support).data;
    piVar10 = (this->ushead).data;
    uVar21 = 0;
    do {
      uVar13 = piVar10[uVar21];
      if ((int)uVar13 < (int)pvVar6[uVar21].sz) {
        puVar16 = (uint *)(piVar10 + uVar21);
        pvVar8 = (this->body_occ_rules).data;
        do {
          *puVar16 = uVar13 + 1;
          uVar18 = pvVar6[uVar21].data[uVar13];
          if (pvVar8[uVar18].sz != 0) {
            uVar20 = 0;
            do {
              killSupport(this,pvVar8[uVar18].data[uVar20]);
              uVar20 = uVar20 + 1;
              pvVar8 = (this->body_occ_rules).data;
            } while (uVar20 < pvVar8[uVar18].sz);
            pvVar6 = (this->no_support).data;
            piVar10 = (this->ushead).data;
          }
          puVar16 = (uint *)(piVar10 + uVar21);
          uVar13 = *puVar16;
        } while ((int)uVar13 < (int)pvVar6[uVar21].sz);
        uVar18 = (this->no_support).sz;
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 < uVar18);
    local_5c = 0xffffffff;
    if (uVar18 != 0) {
      piVar10 = (this->pufhead).data;
      pvVar6 = (this->no_support).data;
      pbVar12 = (this->no_support_bool).data;
      uVar20 = 0xffffffff;
      uVar21 = 0;
      do {
        pcVar11 = sat.assigns.data;
        uVar18 = piVar10[uVar21];
        if ((int)uVar18 < (int)pvVar6[uVar21].sz) {
          pvVar17 = pvVar6 + uVar21;
          piVar2 = pvVar17->data;
          pLVar3 = (this->lits).data;
          do {
            uVar13 = piVar2[uVar18];
            uVar20 = (ulong)uVar13;
            if ((pbVar12[uVar20] == true) &&
               (uVar1 = pLVar3[uVar20].x,
               (uVar1 & 1) * 2 + -1 != (int)pcVar11[(uint)((int)uVar1 >> 1)])) goto LAB_001d2b6f;
            uVar18 = uVar18 + 1;
            piVar10[uVar21] = uVar18;
          } while ((int)uVar18 < (int)pvVar17->sz);
          uVar20 = (ulong)local_5c;
          uVar13 = local_5c;
LAB_001d2b6f:
          local_5c = uVar13;
          iVar15 = (int)uVar20;
          if (iVar15 != -1) break;
        }
        iVar15 = (int)uVar20;
        uVar21 = uVar21 + 1;
      } while (uVar21 < (this->no_support).sz);
      if (iVar15 != -1) {
        pvVar6 = &this->ufset;
        if ((this->ufset).data != (int *)0x0) {
          pvVar6->sz = 0;
        }
        vec<int>::push(pvVar6,(int *)&local_5c);
        (this->ufset_bool).data[local_5c] = true;
        if ((this->nfset).data != (int *)0x0) {
          (this->nfset).sz = 0;
        }
        local_40 = &(this->ufset).data;
        local_48 = pvVar6;
        if (pvVar6->sz != 0) {
          uVar21 = 0;
          uVar20 = 0;
          do {
            uVar18 = (this->ufset).data[uVar21];
            if ((this->no_support_bool).data[uVar18] == false) {
              propagate();
            }
            pvVar8 = (this->head_occ_rules).data;
            if (pvVar8[uVar18].sz != 0) {
              uVar19 = 0;
              pcVar11 = sat.assigns.data;
              lVar9.value = ::l_False.value;
              do {
                pCVar4 = pvVar8[uVar18].data[uVar19];
                uVar13 = (pCVar4->body_lit).x;
                cVar14 = -pcVar11[(uint)((int)uVar13 >> 1)];
                if ((uVar13 & 1) == 0) {
                  cVar14 = pcVar11[(uint)((int)uVar13 >> 1)];
                }
                if (cVar14 != lVar9.value) {
                  pCVar4->w = pCVar4->sz + -1;
                  bVar5 = propRule(this,pCVar4);
                  if (bVar5) break;
                  pvVar8 = (this->head_occ_rules).data;
                  pcVar11 = sat.assigns.data;
                  lVar9 = ::l_False;
                }
                uVar19 = uVar19 + 1;
              } while (uVar19 < pvVar8[uVar18].sz);
            }
            if ((int)uVar20 < (int)(this->nfset).sz) {
              pvVar8 = (this->watches).data;
              do {
                uVar18 = (this->nfset).data[uVar20];
                if (pvVar8[uVar18].sz != 0) {
                  uVar19 = 0;
                  do {
                    pCVar4 = pvVar8[uVar18].data[uVar19];
                    if ((this->no_support_bool).data[(uint)pCVar4->head] == true) {
                      uVar13 = (pCVar4->body_lit).x;
                      cVar14 = -sat.assigns.data[(uint)((int)uVar13 >> 1)];
                      if ((uVar13 & 1) == 0) {
                        cVar14 = sat.assigns.data[(uint)((int)uVar13 >> 1)];
                      }
                      if (cVar14 != ::l_False.value) {
                        pCVar4->w = pCVar4->w + -1;
                        propRule(this,pCVar4);
                        pvVar8 = (this->watches).data;
                      }
                    }
                    uVar19 = uVar19 + 1;
                  } while (uVar19 < pvVar8[uVar18].sz);
                }
                if (pvVar8[uVar18].data != (ConjRule **)0x0) {
                  pvVar8[uVar18].sz = 0;
                }
                uVar18 = (int)uVar20 + 1;
                uVar20 = (ulong)uVar18;
              } while ((int)uVar18 < (int)(this->nfset).sz);
            }
            uVar21 = uVar21 + 1;
          } while (uVar21 < local_48->sz);
        }
        pvVar6 = local_48;
        this->index = 0;
        if ((this->indices).sz != 0) {
          piVar10 = (this->indices).data;
          piVar2 = (this->lowlink).data;
          uVar21 = 0;
          do {
            piVar10[uVar21] = -1;
            piVar2[uVar21] = -1;
            uVar21 = uVar21 + 1;
          } while (uVar21 < (this->indices).sz);
        }
        vec<vec<int>_>::clear(&this->sccs,false);
        uVar18 = (this->ufset).sz;
        uVar13 = 0;
        if (uVar18 != 0) {
          uVar21 = 0;
          do {
            uVar13 = (this->ufset).data[uVar21];
            if (((this->no_support_bool).data[uVar13] == true) &&
               ((this->indices).data[uVar13] == -1)) {
              strongconnect(this,uVar13,getDynamicEdges);
              uVar18 = (this->ufset).sz;
            }
            uVar21 = uVar21 + 1;
            uVar13 = uVar18;
          } while (uVar21 < uVar18);
        }
        local_58.sz = 1;
        local_58.cap = 1;
        local_58.data = (Lit *)malloc(4);
        (local_58.data)->x = -2;
        if (uVar13 == 0) {
          uVar18 = 1;
        }
        else {
          uVar21 = 0;
          do {
            piVar10 = (this->ufset).data;
            uVar20 = (ulong)(uint)piVar10[uVar21];
            (this->ufset_bool).data[uVar20] = false;
            pvVar8 = (this->watches).data;
            if (pvVar8[uVar20].data != (ConjRule **)0x0) {
              pvVar8[uVar20].sz = 0;
              uVar20 = (ulong)(uint)piVar10[uVar21];
            }
            if (((this->no_support_bool).data[uVar20] == true) &&
               (pvVar8 = (this->head_occ_rules).data, pvVar8[uVar20].sz != 0)) {
              uVar19 = 0;
              pcVar11 = sat.assigns.data;
              lVar9.value = ::l_False.value;
              do {
                uVar18 = (pvVar8[uVar20].data[uVar19]->body_lit).x;
                cVar14 = -pcVar11[(uint)((int)uVar18 >> 1)];
                if ((uVar18 & 1) == 0) {
                  cVar14 = pcVar11[(uint)((int)uVar18 >> 1)];
                }
                if (cVar14 == lVar9.value) {
                  vec<Lit>::push(&local_58,&pvVar8[uVar20].data[uVar19]->body_lit);
                  pvVar8 = (this->head_occ_rules).data;
                  pcVar11 = sat.assigns.data;
                  lVar9 = ::l_False;
                }
                uVar19 = uVar19 + 1;
              } while (uVar19 < pvVar8[uVar20].sz);
              uVar13 = local_48->sz;
            }
            uVar21 = uVar21 + 1;
          } while (uVar21 < uVar13);
          pvVar6 = local_48;
          uVar18 = local_58.sz;
        }
        local_38._pt = (Clause *)malloc((long)(int)uVar18 * 4 + 8);
        *(uint *)local_38._pt = uVar18 << 8 | 2;
        vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_38._pt);
        r = local_38;
        if (1 < local_58.sz) {
          uVar18 = *(uint *)local_38._pt;
          uVar21 = 1;
          do {
            if (uVar18 >> 8 <= uVar21) {
              abort();
            }
            (local_38._pt)->data[uVar21].x = local_58.data[uVar21].x;
            uVar21 = uVar21 + 1;
          } while (uVar21 < (local_58._0_8_ & 0xffffffff));
        }
        uVar18 = pvVar6->sz;
        if (uVar18 != 0) {
          pbVar12 = (this->no_support_bool).data;
          uVar21 = 0;
          do {
            uVar13 = (*local_40)[uVar21];
            if (pbVar12[uVar13] == true) {
              SAT::cEnqueue(&sat,(Lit)((this->lits).data[uVar13].x ^ 1),(Reason)r);
              if (sat.confl != (Clause *)0x0) {
                bVar5 = false;
                goto LAB_001d3088;
              }
              pbVar12 = (this->no_support_bool).data;
              pbVar12[uVar13] = false;
              uVar18 = (this->ufset).sz;
            }
            uVar21 = uVar21 + 1;
          } while (uVar21 < uVar18);
        }
        local_38 = (anon_union_8_2_743a5d44_for_Reason_0)this;
        vec<Propagator_*>::push
                  (engine.p_queue.data + (uint)(this->super_Propagator).priority,
                   (Propagator **)&local_38._pt);
        bVar5 = true;
LAB_001d3088:
        if (local_58.data != (Lit *)0x0) {
          free(local_58.data);
          return bVar5;
        }
        return bVar5;
      }
    }
    if ((this->no_support).sz != 0) {
      piVar10 = (this->ushead).data;
      piVar2 = (this->pufhead).data;
      ppiVar7 = &((this->no_support).data)->data;
      uVar21 = 0;
      do {
        if (*ppiVar7 != (int *)0x0) {
          ((vec<int> *)(ppiVar7 + -1))->sz = 0;
        }
        piVar10[uVar21] = 0;
        piVar2[uVar21] = 0;
        uVar21 = uVar21 + 1;
        ppiVar7 = ppiVar7 + 2;
      } while (uVar21 < (this->no_support).sz);
    }
  }
  return true;
}

Assistant:

bool propagate() override {
		// find all unsupported
		if (DEBUG) {
			printf("propagating\n");
		}

		for (unsigned int i = 0; i < dead_rules.size(); i++) {
			killSupport(rules[dead_rules[i]]);
		}

		for (unsigned int i = 0; i < no_support.size(); i++) {
			while (ushead[i] < static_cast<int>(no_support[i].size())) {
				const int x = no_support[i][ushead[i]++];
				for (unsigned int j = 0; j < body_occ_rules[x].size(); j++) {
					killSupport(body_occ_rules[x][j]);
				}
			}
		}

		if (DEBUG) {
			printf("Decision level: %d\n", engine.decisionLevel());
		}

		if (DEBUG) {
			printf("No support: ");
		}
		if (DEBUG) {
			for (unsigned int i = 0; i < no_support.size(); i++) {
				for (unsigned int j = 0; j < no_support[i].size(); j++) {
					printf("%d, ", no_support[i][j]);
				}
			}
		}
		if (DEBUG) {
			printf("\n");
		}

		int start = -1;
		// pick one to start building unfounded set
		for (unsigned int i = 0; i < no_support.size(); i++) {
			for (; pufhead[i] < static_cast<int>(no_support[i].size()); pufhead[i]++) {
				const int x = no_support[i][pufhead[i]];
				if (no_support_bool[x] && !BoolView(lits[x]).isFalse()) {
					start = x;
					break;
				}
			}
			if (start != -1) {
				break;
			}
		}

		// if all processed, we're done
		if (start == -1) {
			if (DEBUG) {
				printf("all done\n");
			}
			for (unsigned int i = 0; i < no_support.size(); i++) {
				no_support[i].clear();
				ushead[i] = 0;
				pufhead[i] = 0;
			}
			return true;
		}

		// start building unfounded set

		ufset.clear();
		ufset.push(start);
		ufset_bool[start] = true;

		if (DEBUG) {
			printf("starting with %d\n", start);
		}

		nfset.clear();
		int nfshead = 0;

		for (unsigned int uf = 0; uf < ufset.size(); uf++) {
			const int h = ufset[uf];
			if (!no_support_bool[h]) {
				fprintf(stderr, "not no_support %d!\n", h);
				for (unsigned int k = 0; k < ufset.size(); k++) {
					fprintf(stderr, "%d ", ufset[k]);
				}
				fprintf(stderr, "- %d %d\n", uf, h);
			}
			assert(no_support_bool[h]);
			// add rules with h as head
			for (unsigned int i = 0; i < head_occ_rules[h].size(); i++) {
				if (DEBUG) {
					printf("checking %dth rule for %d\n", i, h);
				}
				ConjRule* r = head_occ_rules[h][i];
				if (r->isFalse()) {
					continue;
				}
				r->w = r->sz - 1;
				if (DEBUG) {
					printf("proping rule\n");
				}
				if (propRule(*r)) {
					break;
				}
			}

			// propagate nfset

			while (nfshead < static_cast<int>(nfset.size())) {
				const int x = nfset[nfshead++];
				for (unsigned int i = 0; i < watches[x].size(); i++) {
					ConjRule* r = watches[x][i];
					// if head already founded by another rule, ignore
					if (!no_support_bool[r->head]) {
						continue;
					}
					if (r->isFalse()) {
						continue;
					}
					r->w--;
					propRule(*r);
				}
				watches[x].clear();
			}
		}

		// we have now found an unfounded set! i.e., everything in ufset which is still not justified

		// if empty, should jump straight back up!

		// calc dynamic SCC
		//		fprintf(stderr, "calc Dyn SCC\n");

		index = 0;
		assert(S.size() == 0);
		for (unsigned int i = 0; i < indices.size(); i++) {
			indices[i] = -1;
			lowlink[i] = -1;
		}
		sccs.clear();

		for (unsigned int i = 0; i < ufset.size(); i++) {
			const int h = ufset[i];
			if (!no_support_bool[h]) {
				continue;
			}
			if (indices[h] != -1) {
				continue;
			}
			//			fprintf(stderr, "root %d ", h);
			strongconnect(h, &getDynamicEdges);
		}

		assert(S.size() == 0);

		//		if (sccs.size() > 0) fprintf(stderr, "d %d ", sccs.size());

		// create an explanation

		vec<Lit> ps(1);

		for (unsigned int i = 0; i < ufset.size(); i++) {
			ufset_bool[ufset[i]] = false;
			watches[ufset[i]].clear();
			const int h = ufset[i];
			if (!no_support_bool[h]) {
				continue;
			}
			for (unsigned int i = 0; i < head_occ_rules[h].size(); i++) {
				ConjRule* r = head_occ_rules[h][i];
				if (r->isFalse()) {
					ps.push(r->body_lit);
				}
			}
		}

		Clause* expl = Reason_new(ps.size());
		for (unsigned int i = 1; i < ps.size(); i++) {
			(*expl)[i] = ps[i];
		}
		for (unsigned int i = 0; i < ufset.size(); i++) {
			const int h = ufset[i];
			if (!no_support_bool[h]) {
				continue;
			}
			if (DEBUG) {
				printf("making %d false\n", h);
			}
			if (ADD_CLAUSES) {
				ps[0] = ~lits[h];
				sat.addClause(*Clause_new(ps, false), false);
			}
			assert(!BoolView(lits[h]).isFalse());
			if (!BoolView(lits[h]).setVal(false, expl)) {
				return false;
			}
			no_support_bool[h] = false;
		}

		if (DEBUG) {
			printf("reawaken\n");
		}

		// reawaken, this is not quite correct
		engine.p_queue[priority].push(this);

		return true;
	}